

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

uchar __thiscall IDisk::GetNextByte(IDisk *this,int side,uint track,uint offset)

{
  int local_24;
  uchar b;
  int i;
  uchar return_value;
  uint offset_local;
  uint track_local;
  int side_local;
  IDisk *this_local;
  
  b = '\0';
  i = offset + 1;
  for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 2) {
    if (this->side_[side].tracks[track].size <= (uint)i) {
      i = (uint)i % this->side_[side].tracks[track].size;
    }
    b = b << 1 | this->side_[side].tracks[track].bitfield[(uint)i] & 1;
    i = i + 2;
  }
  return b;
}

Assistant:

unsigned char IDisk::GetNextByte(int side, unsigned int track, unsigned int offset) const
{
   unsigned char return_value = 0;

   //
   offset++;
   for (int i = 0; i < 16; i += 2)
   {
      return_value <<= 1;
      if (offset >= side_[side].tracks[track].size)
         offset = offset % side_[side].tracks[track].size;

      const unsigned char b = side_[side].tracks[track].bitfield[offset];
      return_value |= b & 0x1;
      offset += 2;
   }

   return return_value;
}